

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodCompiler::visitBlockExpression(MethodCompiler *this,BlockExpression *node)

{
  Assembler *this_00;
  FunctionalNode *this_01;
  element_type *peVar1;
  long lVar2;
  int iVar3;
  SequenceNode *pSVar4;
  Oop OVar5;
  Label *blockEnd;
  undefined4 extraout_var_00;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar6;
  LocalVariables *pLVar7;
  size_t sVar8;
  pointer psVar9;
  InstructionNode *pIVar10;
  InstructionNode *pIVar11;
  long lVar12;
  size_t i_1;
  ulong uVar13;
  size_t i_2;
  ulong uVar14;
  int i;
  int iVar15;
  int arraySize;
  ulong uVar16;
  bool bVar17;
  undefined4 extraout_var;
  
  iVar3 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])(node);
  if ((char)iVar3 == '\0') {
    this_01 = this->localContext;
    this->localContext = &node->super_FunctionalNode;
    this_00 = &this->gen;
    blockEnd = MethodAssembler::Assembler::makeLabel(this_00);
    iVar3 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])(node);
    arraySize = 0;
    if ((ArgumentList *)CONCAT44(extraout_var_00,iVar3) == (ArgumentList *)0x0) {
      uVar16 = 0;
    }
    else {
      pvVar6 = AST::ArgumentList::getArguments((ArgumentList *)CONCAT44(extraout_var_00,iVar3));
      uVar16 = (long)(pvVar6->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar6->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    pLVar7 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
    psVar9 = (pLVar7->
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(pLVar7->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4;
    iVar3 = this->temporalVectorCount;
    while (bVar17 = lVar12 != 0, lVar12 = lVar12 + -1, bVar17) {
      peVar1 = (psVar9->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar1->isCapturedInClosure_ == true) {
        peVar1->temporalVectorIndex = iVar3;
        peVar1->temporalIndex = arraySize;
        arraySize = arraySize + 1;
      }
      psVar9 = psVar9 + 1;
    }
    if (iVar3 == 0) {
      iVar15 = 1;
    }
    else {
      sVar8 = AST::FunctionalNode::getArgumentCount(this_01);
      for (iVar15 = 0; iVar15 < this->temporalVectorCount; iVar15 = iVar15 + 1) {
        MethodAssembler::Assembler::pushTemporal(this_00,(int)sVar8 + iVar15);
      }
      iVar15 = this->temporalVectorCount + 1;
    }
    if (arraySize != 0) {
      this->temporalVectorCount = iVar15;
      iVar3 = iVar3 + 1;
    }
    uVar14 = (ulong)(arraySize != 0);
    psVar9 = (pLVar7->
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(pLVar7->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9;
    for (uVar13 = 0; iVar15 = (int)uVar16, lVar12 >> 4 != uVar13; uVar13 = uVar13 + 1) {
      peVar1 = (psVar9->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar1->isCapturedInClosure_ == false) {
        if (uVar13 < uVar16) {
          peVar1->temporalIndex = (int)uVar13;
        }
        else {
          peVar1->temporalIndex = iVar15 + iVar3;
          uVar14 = uVar14 + 1;
          iVar3 = iVar3 + 1;
        }
      }
      psVar9 = psVar9 + 1;
    }
    if (uVar14 != 0) {
      MethodAssembler::Assembler::pushNClosureTemps(this_00,(int)uVar14);
    }
    MethodAssembler::Assembler::pushClosure(this_00,iVar3,iVar15,blockEnd,0);
    if (arraySize != 0) {
      MethodAssembler::Assembler::pushNewArray(this_00,arraySize);
      MethodAssembler::Assembler::popStoreTemporal(this_00,iVar15 + this->temporalVectorCount + -1);
      lVar12 = 0;
      for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        psVar9 = (pLVar7->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)(*(long *)((long)&(psVar9->
                                       super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar12) + 0x19) == '\x01') {
          MethodAssembler::Assembler::pushTemporal(this_00,(int)uVar13);
          lVar2 = *(long *)((long)&(psVar9->
                                   super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar12);
          MethodAssembler::Assembler::popStoreTemporalInVector
                    (this_00,*(int *)(lVar2 + 8),*(int *)(lVar2 + 0xc));
        }
        lVar12 = lVar12 + 0x10;
      }
    }
    pIVar10 = MethodAssembler::Assembler::getLastInstruction(this_00);
    pSVar4 = AST::BlockExpression::getBody(node);
    (*(pSVar4->super_Node)._vptr_Node[2])(pSVar4,this);
    bVar17 = MethodAssembler::Assembler::isLastReturn(this_00);
    if (!bVar17) {
      pIVar11 = MethodAssembler::Assembler::getLastInstruction(this_00);
      if (pIVar11 == pIVar10) {
        MethodAssembler::Assembler::blockReturnNil(this_00);
      }
      else {
        MethodAssembler::Assembler::blockReturnTop(this_00);
      }
    }
    MethodAssembler::Assembler::putLabel(this_00,blockEnd);
    this->localContext = this_01;
    if (arraySize != 0) {
      this->temporalVectorCount = this->temporalVectorCount + -1;
    }
    return (Oop)&NilObject;
  }
  pSVar4 = AST::BlockExpression::getBody(node);
  OVar5.field_0._0_4_ = (*(pSVar4->super_Node)._vptr_Node[2])(pSVar4,this);
  OVar5.field_0.uintValue._4_4_ = extraout_var;
  return (Oop)OVar5.field_0;
}

Assistant:

Oop MethodCompiler::visitBlockExpression(BlockExpression *node)
{
    if(node->isInlined())
    {
        // Visit the method body
        return node->getBody()->acceptVisitor(this);
    }

    // Store the local context
    auto oldLocalContext = localContext;
    localContext = node;

    auto blockEnd = gen.makeLabel();

    // Process the arguments
    auto argumentList = node->getArgumentList();
    size_t argumentCount = 0;
    if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    auto capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(capturedCount++);
        }
    }

    // Push the captured temporal vectors.
    size_t numCopied = temporalVectorCount;
    size_t numLocals = 0;
    if(temporalVectorCount)
    {
        auto oldArgumentCount = oldLocalContext->getArgumentCount();
        for(auto i = 0; i < temporalVectorCount; ++i)
            gen.pushTemporal(int(oldArgumentCount + i));

    }

    if(capturedCount)
    {
        ++temporalVectorCount;

        // Reserve space for the inner temporal vector.
        ++numLocals;
        ++numCopied;
    }

    // Prepare the local variables of the block.
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
            continue;

        if(i < argumentCount)
        {
            localVar->setTemporalIndex((int)i);
        }
        else
        {
            localVar->setTemporalIndex(int(argumentCount + numCopied));
            ++numLocals;
            ++numCopied;
        }
    }

    // Reserve space for the locals.
    if(numLocals)
        gen.pushNClosureTemps((int)numLocals);

    // Push the block.
    gen.pushClosure((int)numCopied, (int)argumentCount, blockEnd, 0);

    // Generate the inner temporal vector.
    if(capturedCount)
    {
        gen.pushNewArray(capturedCount);
        gen.popStoreTemporal(int(argumentCount + temporalVectorCount - 1));

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), localVar->getTemporalVectorIndex());
            }
        }
    }

    auto closureBeginInstruction = gen.getLastInstruction();

    // Generate the block body.
    node->getBody()->acceptVisitor(this);

    // Always return
	if(!gen.isLastReturn())
    {
        if(gen.getLastInstruction() == closureBeginInstruction)
            gen.blockReturnNil();
        else
            gen.blockReturnTop();
    }

    // Finish the block.
    gen.putLabel(blockEnd);

    // Restore the local context
    localContext = oldLocalContext;

    if(capturedCount)
        --temporalVectorCount;

	return Oop();
}